

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O3

void __thiscall
AstWalker::visitObjectDeclarationExpressionAstNode
          (AstWalker *this,ObjectDeclarationExpressionAstNode *node)

{
  pointer ppVar1;
  pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_> *kv;
  pointer ppVar2;
  
  (*this->_vptr_AstWalker[0x20])();
  ppVar1 = (node->keyValues).
           super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (node->keyValues).
                super__Vector_base<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>,_std::allocator<std::pair<std::shared_ptr<Token>,_std::shared_ptr<ExpressionAstNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    (*this->_vptr_AstWalker[3])
              (this,(ppVar2->second).
                    super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  (*this->_vptr_AstWalker[0x2f])(this,node);
  return;
}

Assistant:

void AstWalker::visitObjectDeclarationExpressionAstNode(ObjectDeclarationExpressionAstNode* node) noexcept {
  this->onEnterObjectDeclarationExpressionAstNode(node);
  for (auto & kv : node->keyValues) {
    this->visitExpressionAstNode(kv.second.get());
  }
  this->onExitObjectDeclarationExpressionAstNode(node);
}